

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O0

TsStatus_t ts_message_get_at(TsMessageRef_t array,size_t index,TsMessageRef_t *item)

{
  TsMessageRef_t *item_local;
  size_t index_local;
  TsMessageRef_t array_local;
  
  if ((array == (TsMessageRef_t)0x0) || (array->type != TsTypeArray)) {
    array_local._4_4_ = TsStatusErrorPreconditionFailed;
  }
  else if ((index < 0xf) && (*(long *)(array->name + index * 8 + 0x1c) != 0)) {
    *item = *(TsMessageRef_t *)(array->name + index * 8 + 0x1c);
    array_local._4_4_ = TsStatusOk;
  }
  else {
    array_local._4_4_ = TsStatusErrorIndexOutOfRange;
  }
  return array_local._4_4_;
}

Assistant:

TsStatus_t ts_message_get_at(TsMessageRef_t array, size_t index, TsMessageRef_t *item)
{
	/* check preconditions */
	if (array == NULL || array->type != TsTypeArray) {
		return TsStatusErrorPreconditionFailed;
	}
	if (index >= TS_MESSAGE_MAX_BRANCHES || array->value._xfields[index] == NULL) {
		return TsStatusErrorIndexOutOfRange;
	}

	/* return indexed value */
	*item = array->value._xfields[index];
	return TsStatusOk;
}